

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_io.c
# Opt level: O0

size_t uo_io_write(int wfd,void *buf,size_t len)

{
  long *in_FS_OFFSET;
  ssize_t wlen;
  size_t len_local;
  void *buf_local;
  size_t sStack_10;
  int wfd_local;
  
  sStack_10 = write(wfd,buf,len);
  if (sStack_10 == 0xffffffffffffffff) {
    *(undefined4 *)(*in_FS_OFFSET + -0x50) = 1;
    sStack_10 = 0;
  }
  else {
    *(undefined4 *)(*in_FS_OFFSET + -0x50) = 0;
  }
  return sStack_10;
}

Assistant:

size_t uo_io_write(
    int wfd,
    const void *buf,
    size_t len)
{
    #ifdef _WIN32

        DWORD wlen;
        OVERLAPPED overlapped = { 0 };

        if (!WriteFile((HANDLE)(uintptr_t)wfd, buf, len, &wlen, &overlapped))
        {
            // TODO: specify what error occurred
            uo_io_errno = UO_IO_ERR_UNKNOWN;
            return 0;
        }

    #else

        ssize_t wlen = write(wfd, buf, len);
        
        if (wlen == -1)
        {
            // TODO: specify what error occurred
            uo_io_errno = UO_IO_ERR_UNKNOWN;
            return 0;
        }

    #endif

        uo_io_errno = UO_IO_ERR_NONE;

        return wlen;
}